

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::Solver(Solver *this)

{
  this->_vptr_Solver = (_func_int **)&PTR__Solver_0011ad00;
  (this->model).data = (lbool *)0x0;
  (this->model).sz = 0;
  (this->model).cap = 0;
  (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.data = (char *)0x0;
  (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.sz = 0;
  (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.cap = 0;
  (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.data = (Lit *)0x0;
  (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.sz = 0;
  (this->conflict).super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.xs.cap = 0;
  this->verbosity = 0;
  this->var_decay = opt_var_decay.value;
  this->clause_decay = opt_clause_decay.value;
  this->random_var_freq = opt_random_var_freq.value;
  this->random_seed = opt_random_seed.value;
  this->luby_restart = opt_luby_restart.value;
  this->ccmin_mode = opt_ccmin_mode.value;
  this->phase_saving = opt_phase_saving.value;
  this->rnd_pol = false;
  this->rnd_init_act = opt_rnd_init_act.value;
  this->garbage_frac = opt_garbage_frac.value;
  this->min_learnts_lim = opt_min_learnts_lim.value;
  this->restart_first = opt_restart_first.value;
  this->restart_inc = opt_restart_inc.value;
  this->learntsize_factor = 0.3333333333333333;
  this->learntsize_inc = 1.1;
  this->learntsize_adjust_start_confl = 100;
  this->learntsize_adjust_inc = 1.5;
  (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data =
       (lbool *)0x0;
  (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
  (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->polarity).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.data =
       (lbool *)0x0;
  (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->user_pol).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
  (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->decision).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.
  data = (VarData *)0x0;
  (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.sz
       = 0;
  (this->vardata).super_IntMap<int,_Minisat::Solver::VarData,_Minisat::MkIndexDefault<int>_>.map.cap
       = 0;
  (this->watches).occs.map.data = (vec<Minisat::Solver::Watcher,_int> *)0x0;
  (this->watches).occs.map.sz = 0;
  (this->watches).occs.map.cap = 0;
  (this->watches).dirty.map.data = (char *)0x0;
  (this->watches).dirty.map.sz = 0;
  (this->watches).dirty.map.cap = 0;
  (this->watches).dirties.data = (Lit *)0x0;
  (this->watches).dirties.sz = 0;
  (this->watches).dirties.cap = 0;
  memset(&this->solves,0,200);
  (this->watches).deleted.ca = &this->ca;
  (this->order_heap).heap.data = (int *)0x0;
  (this->order_heap).heap.sz = 0;
  (this->order_heap).heap.cap = 0;
  (this->order_heap).indices.map.data = (int *)0x0;
  (this->order_heap).indices.map.sz = 0;
  (this->order_heap).indices.map.cap = 0;
  (this->order_heap).lt.activity =
       &(this->activity).super_IntMap<int,_double,_Minisat::MkIndexDefault<int>_>;
  this->ok = true;
  this->cla_inc = 1.0;
  this->var_inc = 1.0;
  this->qhead = 0;
  this->simpDB_assigns = -1;
  this->simpDB_props = 0;
  this->progress_estimate = 0.0;
  this->remove_satisfied = true;
  *(undefined8 *)&this->next_var = 0;
  *(undefined8 *)((long)&(this->ca).ra.memory + 4) = 0;
  (this->ca).ra.cap = 0;
  (this->ca).ra.wasted_ = 0;
  RegionAllocator<unsigned_int>::capacity(&(this->ca).ra,0x100000);
  (this->ca).extra_clause_field = false;
  (this->released_vars).data = (int *)0x0;
  (this->released_vars).sz = 0;
  (this->released_vars).cap = 0;
  (this->free_vars).data = (int *)0x0;
  (this->free_vars).sz = 0;
  (this->free_vars).cap = 0;
  (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.data = (char *)0x0;
  (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.sz = 0;
  (this->seen).super_IntMap<int,_char,_Minisat::MkIndexDefault<int>_>.map.cap = 0;
  (this->analyze_stack).data = (ShrinkStackElem *)0x0;
  (this->analyze_stack).sz = 0;
  (this->analyze_stack).cap = 0;
  (this->analyze_toclear).data = (Lit *)0x0;
  (this->analyze_toclear).sz = 0;
  (this->analyze_toclear).cap = 0;
  (this->add_tmp).data = (Lit *)0x0;
  (this->add_tmp).sz = 0;
  (this->add_tmp).cap = 0;
  *(undefined4 *)&this->conflict_budget = 0xffffffff;
  *(undefined4 *)((long)&this->conflict_budget + 4) = 0xffffffff;
  *(undefined4 *)&this->propagation_budget = 0xffffffff;
  *(undefined4 *)((long)&this->propagation_budget + 4) = 0xffffffff;
  this->asynch_interrupt = false;
  return;
}

Assistant:

Solver::Solver() :

    // Parameters (user settable):
    //
    verbosity        (0)
  , var_decay        (opt_var_decay)
  , clause_decay     (opt_clause_decay)
  , random_var_freq  (opt_random_var_freq)
  , random_seed      (opt_random_seed)
  , luby_restart     (opt_luby_restart)
  , ccmin_mode       (opt_ccmin_mode)
  , phase_saving     (opt_phase_saving)
  , rnd_pol          (false)
  , rnd_init_act     (opt_rnd_init_act)
  , garbage_frac     (opt_garbage_frac)
  , min_learnts_lim  (opt_min_learnts_lim)
  , restart_first    (opt_restart_first)
  , restart_inc      (opt_restart_inc)

    // Parameters (the rest):
    //
  , learntsize_factor((double)1/(double)3), learntsize_inc(1.1)

    // Parameters (experimental):
    //
  , learntsize_adjust_start_confl (100)
  , learntsize_adjust_inc         (1.5)

    // Statistics: (formerly in 'SolverStats')
    //
  , solves(0), starts(0), decisions(0), rnd_decisions(0), propagations(0), conflicts(0)
  , dec_vars(0), num_clauses(0), num_learnts(0), clauses_literals(0), learnts_literals(0), max_literals(0), tot_literals(0)

  , watches            (WatcherDeleted(ca))
  , order_heap         (VarOrderLt(activity))
  , ok                 (true)
  , cla_inc            (1)
  , var_inc            (1)
  , qhead              (0)
  , simpDB_assigns     (-1)
  , simpDB_props       (0)
  , progress_estimate  (0)
  , remove_satisfied   (true)
  , next_var           (0)

    // Resource constraints:
    //
  , conflict_budget    (-1)
  , propagation_budget (-1)
  , asynch_interrupt   (false)
{}